

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::Composition::Composition
          (Composition *this,shared_ptr<rlottie::internal::model::Composition> *model)

{
  Layer *in_RAX;
  Layer *pLVar1;
  VArenaAlloc *unaff_RBX;
  
  SurfaceCache::SurfaceCache(&this->mSurfaceCache);
  (this->mSurface).mImpl.mModel = (model *)0x0;
  VMatrix::VMatrix(&this->mScaleMatrix);
  (this->mModel).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mRootLayer = (Layer *)0x0;
  (this->mViewSize).mw = 0;
  (this->mViewSize).mh = 0;
  (this->mModel).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  VArenaAlloc::VArenaAlloc(&this->mAllocator,0x800);
  this->mCurFrameNo = -1;
  this->mKeepAspectRatio = true;
  this->mHasDynamicValue = false;
  std::__shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mModel).
              super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>,
             &model->
              super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pLVar1 = createLayerItem(in_RAX,unaff_RBX);
  this->mRootLayer = pLVar1;
  pLVar1->mComplexContent = false;
  this->mViewSize =
       ((this->mModel).
        super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->mSize;
  return;
}

Assistant:

renderer::Composition::Composition(std::shared_ptr<model::Composition> model)
    : mCurFrameNo(-1)
{
    mModel = std::move(model);
    mRootLayer = createLayerItem(mModel->mRootLayer, &mAllocator);
    mRootLayer->setComplexContent(false);
    mViewSize = mModel->size();
}